

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O3

type __thiscall
dg::pta::PointerGraph::nodeFactory<(dg::pta::PSNodeType)2,dg::pta::PSNode*&,dg::pta::PSNode>
          (PointerGraph *this,PSNode **args)

{
  int iVar1;
  type pPVar2;
  
  pPVar2 = (type)operator_new(0xe8);
  iVar1 = *(int *)(this + 0x40);
  *(IDType *)(this + 0x40) = iVar1 + 1U;
  (pPVar2->super_SubgraphNode<dg::pta::PSNode>).id = iVar1 + 1U;
  (pPVar2->super_SubgraphNode<dg::pta::PSNode>).data = (void *)0x0;
  (pPVar2->super_SubgraphNode<dg::pta::PSNode>).user_data = (void *)0x0;
  (pPVar2->super_SubgraphNode<dg::pta::PSNode>).scc_id = 0;
  (pPVar2->super_SubgraphNode<dg::pta::PSNode>)._successors.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar2->super_SubgraphNode<dg::pta::PSNode>)._successors.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar2->super_SubgraphNode<dg::pta::PSNode>)._successors.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pPVar2->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar2->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar2->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pPVar2->super_SubgraphNode<dg::pta::PSNode>).operands.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar2->super_SubgraphNode<dg::pta::PSNode>).operands.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar2->super_SubgraphNode<dg::pta::PSNode>).operands.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pPVar2->super_SubgraphNode<dg::pta::PSNode>).users.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar2->super_SubgraphNode<dg::pta::PSNode>).users.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar2->super_SubgraphNode<dg::pta::PSNode>).users.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pPVar2->super_SubgraphNode<dg::pta::PSNode>).size = 0;
  pPVar2->_vptr_PSNode = (_func_int **)&PTR__PSNode_0012bb58;
  pPVar2->type = LOAD;
  *(undefined8 *)
   &(pPVar2->pointsTo).pointers._bits.
    super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
    .
    super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ._M_h._M_rehash_policy = 0;
  pPVar2->pairedNode = (PSNode *)0x0;
  pPVar2->_parent = (PointerSubgraph *)0x0;
  pPVar2->dfsid = 0;
  (pPVar2->pointsTo).pointers._bits.
  super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
  .
  super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ._M_h._M_buckets =
       &(pPVar2->pointsTo).pointers._bits.
        super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
        .
        super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
        ._M_h._M_single_bucket;
  (pPVar2->pointsTo).pointers._bits.
  super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
  .
  super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ._M_h._M_bucket_count = 1;
  (pPVar2->pointsTo).pointers._bits.
  super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
  .
  super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pPVar2->pointsTo).pointers._bits.
  super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
  .
  super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ._M_h._M_element_count = 0;
  (pPVar2->pointsTo).pointers._bits.
  super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
  .
  super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(size_t *)
   ((long)&(pPVar2->pointsTo).pointers._bits.
           super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
           .
           super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ._M_h._M_rehash_policy + 8) = 0;
  (pPVar2->pointsTo).pointers._bits.
  super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
  .
  super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  SubgraphNode<dg::pta::PSNode>::addOperand<dg::pta::PSNode*,dg::pta::PSNode>
            (&pPVar2->super_SubgraphNode<dg::pta::PSNode>,*args);
  return pPVar2;
}

Assistant:

typename std::enable_if<std::is_same<Node, PSNode>::value, Node *>::type
    nodeFactory(Args &&...args) {
        static_assert(expected_args_size<Type, sizeof...(args)>() ==
                              sizeof...(args),
                      "Incorrect number of arguments");
        return new Node(getNewNodeId(), Type, std::forward<Args>(args)...);
    }